

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_simple_motion_search_early_term_none
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,RD_STATS *none_rdc,
               PartitionSearchState *part_state)

{
  _Bool _Var1;
  MACROBLOCK *in_RCX;
  AV1_COMP *in_RDX;
  SIMPLE_MOTION_DATA_TREE *in_R8;
  float *unaff_retaddr;
  int in_stack_00000008;
  float score;
  float *ml_model;
  float *ml_std;
  float *ml_mean;
  int in_stack_00000038;
  int f_idx;
  float features [28];
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams *blk_params;
  int *in_stack_00002a58;
  float *in_stack_00002a60;
  AV1_COMP *in_stack_00002a68;
  float local_dc;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  int local_bc;
  float local_b8 [31];
  char local_39;
  undefined4 local_38;
  BLOCK_SIZE bsize_00;
  SIMPLE_MOTION_DATA_TREE **ppSVar2;
  
  ppSVar2 = in_R8->split;
  bsize_00 = (BLOCK_SIZE)((uint)*(undefined4 *)((long)in_R8->split + 4) >> 0x18);
  local_38 = *(undefined4 *)(in_R8->split + 1);
  local_39 = (char)in_R8->start_mvs[2].row;
  memset(local_b8,0,0x70);
  simple_motion_search_prune_part_features
            (in_RDX,in_RCX,in_R8,(int)((ulong)ppSVar2 >> 0x20),(int)ppSVar2,bsize_00,unaff_retaddr,
             in_stack_00000008);
  local_b8[0x19] = log1pf((float)*(int *)&in_RCX->plane[0].src_diff);
  local_b8[0x1a] = log1pf((float)(long)in_RCX->plane[0].dqcoeff);
  local_b8[0x1b] = log1pf((float)(long)in_RCX->plane[0].qcoeff);
  local_c8 = (float *)0x0;
  local_d0 = (float *)0x0;
  local_d8 = (float *)0x0;
  if (local_39 == '\x0f') {
    local_c8 = av1_simple_motion_search_term_none_mean_128;
    local_d0 = av1_simple_motion_search_term_none_std_128;
    local_d8 = av1_simple_motion_search_term_none_model_128;
  }
  else if (local_39 == '\f') {
    local_c8 = av1_simple_motion_search_term_none_mean_64;
    local_d0 = av1_simple_motion_search_term_none_std_64;
    local_d8 = av1_simple_motion_search_term_none_model_64;
  }
  else if (local_39 == '\t') {
    local_c8 = av1_simple_motion_search_term_none_mean_32;
    local_d0 = av1_simple_motion_search_term_none_std_32;
    local_d8 = av1_simple_motion_search_term_none_model_32;
  }
  else if (local_39 == '\x06') {
    local_c8 = av1_simple_motion_search_term_none_mean_16;
    local_d0 = av1_simple_motion_search_term_none_std_16;
    local_d8 = av1_simple_motion_search_term_none_model_16;
  }
  write_features_to_file
            ((char *)features._16_8_,features[3]._3_1_,(float *)features._0_8_,f_idx,
             in_stack_00000038,ml_mean._7_1_,(int)features[8],(int)features[10]);
  _Var1 = ext_ml_model_decision_after_none_part2
                    (in_stack_00002a68,in_stack_00002a60,in_stack_00002a58);
  if ((!_Var1) && (local_d8 != (float *)0x0)) {
    local_dc = 0.0;
    for (local_bc = 0; local_bc < 0x1c; local_bc = local_bc + 1) {
      local_dc = (local_d8[local_bc] * (local_b8[local_bc] - local_c8[local_bc])) /
                 local_d0[local_bc] + local_dc;
    }
    if (0.0 <= local_d8[0x1c] + local_dc) {
      in_R8[2].start_mvs[0].row = 1;
      in_R8[2].start_mvs[0].col = 0;
    }
  }
  return;
}

Assistant:

void av1_simple_motion_search_early_term_none(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    const RD_STATS *none_rdc, PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  float features[FEATURE_SIZE_SMS_TERM_NONE] = { 0.0f };
  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, features,
                                           FEATURE_SMS_PRUNE_PART_FLAG);
  int f_idx = FEATURE_SIZE_SMS_PRUNE_PART;

  features[f_idx++] = log1pf((float)none_rdc->rate);
  features[f_idx++] = log1pf((float)none_rdc->dist);
  features[f_idx++] = log1pf((float)none_rdc->rdcost);

  assert(f_idx == FEATURE_SIZE_SMS_TERM_NONE);

  const float *ml_mean = NULL;
  const float *ml_std = NULL;
  const float *ml_model = NULL;

  if (bsize == BLOCK_128X128) {
    ml_mean = av1_simple_motion_search_term_none_mean_128;
    ml_std = av1_simple_motion_search_term_none_std_128;
    ml_model = av1_simple_motion_search_term_none_model_128;
  } else if (bsize == BLOCK_64X64) {
    ml_mean = av1_simple_motion_search_term_none_mean_64;
    ml_std = av1_simple_motion_search_term_none_std_64;
    ml_model = av1_simple_motion_search_term_none_model_64;
  } else if (bsize == BLOCK_32X32) {
    ml_mean = av1_simple_motion_search_term_none_mean_32;
    ml_std = av1_simple_motion_search_term_none_std_32;
    ml_model = av1_simple_motion_search_term_none_model_32;
  } else if (bsize == BLOCK_16X16) {
    ml_mean = av1_simple_motion_search_term_none_mean_16;
    ml_std = av1_simple_motion_search_term_none_std_16;
    ml_model = av1_simple_motion_search_term_none_model_16;
  } else {
    assert(0 && "Unexpected block size in simple_motion_term_none");
  }

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         FEATURE_SIZE_SMS_TERM_NONE, 3, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_none_part2(
          cpi, features, &part_state->terminate_partition_search)) {
    return;
  }

  if (ml_model) {
    float score = 0.0f;
    for (f_idx = 0; f_idx < FEATURE_SIZE_SMS_TERM_NONE; f_idx++) {
      score +=
          ml_model[f_idx] * (features[f_idx] - ml_mean[f_idx]) / ml_std[f_idx];
    }
    score += ml_model[FEATURE_SIZE_SMS_TERM_NONE];

    if (score >= 0.0f) {
      part_state->terminate_partition_search = 1;
    }
  }
}